

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  undefined1 *puVar1;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var2;
  _Bool _Var3;
  CURLcode CVar4;
  
  *protocol_done = false;
  if (((conn->bits).tcpconnect[0] == true) && (((conn->bits).field_0x5 & 0x10) != 0)) {
    if (conn->handler->connecting != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      return CURLE_OK;
    }
    *protocol_done = true;
    return CURLE_OK;
  }
  if (((conn->bits).field_0x5 & 0x10) == 0) {
    CVar4 = Curl_proxy_connect(conn,0);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if ((((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
        ((conn->bits).proxy_ssl_connected[0] == true)) &&
       (((~*(uint *)&(conn->bits).field_0x4 & 0x4020) != 0 ||
        (_Var3 = Curl_connect_ongoing(conn), !_Var3)))) {
      p_Var2 = conn->handler->connect_it;
      if (p_Var2 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
        *protocol_done = true;
        CVar4 = CURLE_OK;
      }
      else {
        CVar4 = (*p_Var2)(conn,protocol_done);
      }
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      puVar1 = &(conn->bits).field_0x5;
      *puVar1 = *puVar1 | 0x10;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result = CURLE_OK;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  if(!conn->bits.protoconnstart) {

    result = Curl_proxy_connect(conn, FIRSTSOCKET);
    if(result)
      return result;

    if(CONNECT_FIRSTSOCKET_PROXY_SSL())
      /* wait for HTTPS proxy SSL initialization to complete */
      return CURLE_OK;

    if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
       Curl_connect_ongoing(conn))
      /* when using an HTTP tunnel proxy, await complete tunnel establishment
         before proceeding further. Return CURLE_OK so we'll be called again */
      return CURLE_OK;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}